

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

time_t __thiscall booster::locale::date_time::time(date_time *this,time_t *__timer)

{
  int iVar1;
  abstract_calendar *paVar2;
  undefined4 extraout_var;
  double in_XMM0_Qa;
  posix_time ptime;
  int nano;
  double fract;
  int64_t seconds;
  double dseconds;
  long local_40;
  int local_38;
  int local_2c;
  double local_28;
  long local_20;
  double local_18;
  double local_10;
  date_time *local_8;
  
  local_10 = in_XMM0_Qa;
  local_8 = this;
  local_18 = floor(in_XMM0_Qa);
  local_40 = (long)local_18;
  local_28 = local_10 - local_18;
  local_2c = (int)(local_28 * 1000000000.0);
  if (local_2c < 0) {
    local_2c = 0;
  }
  else if (999999999 < local_2c) {
    local_2c = 999999999;
  }
  local_38 = local_2c;
  local_20 = local_40;
  paVar2 = hold_ptr<booster::locale::abstract_calendar>::operator->(&this->impl_);
  iVar1 = (*paVar2->_vptr_abstract_calendar[4])(paVar2,&local_40);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

void date_time::time(double v)
{
    double dseconds = floor(v);
    int64_t seconds = static_cast<int64_t>(dseconds);
    double fract = v - dseconds;
    int nano = static_cast<int>(fract * 1e9);
    if(nano < 0)
        nano = 0;
    else if(nano >999999999)
        nano = 999999999;
    posix_time ptime;
    ptime.seconds = seconds;
    ptime.nanoseconds = nano;
    impl_->set_time(ptime);
}